

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O2

void d_string_insert_c(DString *baseString,size_t pos,char insertedCharacter)

{
  ulong uVar1;
  unsigned_long uVar2;
  
  if (insertedCharacter != '\0' && baseString != (DString *)0x0) {
    uVar1 = baseString->currentStringLength;
    if (uVar1 < pos) {
      pos = uVar1;
    }
    ensureStringBufferCanHold(baseString,uVar1 + 1);
    memmove(baseString->str + pos + 1,baseString->str + pos,baseString->currentStringLength - pos);
    baseString->str[pos] = insertedCharacter;
    uVar2 = baseString->currentStringLength;
    baseString->currentStringLength = uVar2 + 1;
    baseString->str[uVar2 + 1] = '\0';
  }
  return;
}

Assistant:

void d_string_insert_c(DString * baseString, size_t pos, char insertedCharacter) {
	if (baseString && insertedCharacter) {
		if (pos > baseString->currentStringLength) {
			pos = baseString->currentStringLength;
		}

		size_t newSizeNeeded = baseString->currentStringLength + 1;
		ensureStringBufferCanHold(baseString, newSizeNeeded);

		/* Shift following string to 'right' */
		memmove(baseString->str + pos + 1, baseString->str + pos, baseString->currentStringLength - pos);

		baseString->str[pos] = insertedCharacter;
		baseString->currentStringLength++;
		baseString->str[baseString->currentStringLength] = '\0';
	}
}